

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestIterationEnd
          (StreamingListener *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  TimeInMillis local_30;
  
  bVar1 = UnitTestImpl::Passed(unit_test->impl_);
  pcVar8 = "0";
  if (bVar1) {
    pcVar8 = "1";
  }
  pcVar7 = "";
  if (bVar1) {
    pcVar7 = "";
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar8,pcVar7);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x71c963);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_c0 = *puVar5;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar5;
    local_d0 = (ulong *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_30 = unit_test->impl_->elapsed_time_;
  StreamableToString<long_long>(&local_b0,&local_30);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < local_b0._M_string_length + local_c8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_c8 <= (ulong)uVar10) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00332ab5;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_00332ab5:
  local_f0 = &local_e0;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_e0 = *plVar2;
    uStack_d8 = puVar3[3];
  }
  else {
    local_e0 = *plVar2;
    local_f0 = (long *)*puVar3;
  }
  local_e8 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f0);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void OnTestIterationEnd(const UnitTest& unit_test, int /* iteration */) {
    SendLn("event=TestIterationEnd&passed=" +
           FormatBool(unit_test.Passed()) + "&elapsed_time=" +
           StreamableToString(unit_test.elapsed_time()) + "ms");
  }